

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O2

ExpandMacroResult
anon_unknown.dwarf_1710cb::ExpandMacros
          (string *out,
          vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
          *macroExpanders,int version)

{
  char cVar1;
  pointer pfVar2;
  bool bVar3;
  ExpandMacroResult EVar4;
  function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>
  *macroExpander;
  char *pcVar5;
  long lVar6;
  pointer this;
  char *pcVar7;
  undefined1 *__it;
  string macroNamespace;
  string result;
  string *local_68;
  string *local_60;
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  *local_58;
  string macroName;
  
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  EVar4 = Ok;
  macroNamespace._M_dataplus._M_p = (pointer)&macroNamespace.field_2;
  macroNamespace._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  macroNamespace.field_2._M_local_buf[0] = '\0';
  macroName._M_dataplus._M_p = (pointer)&macroName.field_2;
  macroName._M_string_length = 0;
  macroName.field_2._M_local_buf[0] = '\0';
  pcVar7 = (out->_M_dataplus)._M_p;
  pcVar5 = pcVar7 + out->_M_string_length;
  local_60 = out;
  local_58 = macroExpanders;
  for (; pcVar7 != pcVar5; pcVar7 = pcVar7 + 1) {
    cVar1 = *pcVar7;
    if (EVar4 == Error) {
      if (cVar1 == '}') {
        this = (macroExpanders->
               super__Vector_base<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
        pfVar2 = (macroExpanders->
                 super__Vector_base<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        do {
          if (this == pfVar2) {
            bVar3 = std::operator==(&macroNamespace,"vendor");
            EVar4 = Error - bVar3;
            goto LAB_00185e3c;
          }
          EVar4 = std::
                  function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>
                  ::operator()(this,&macroNamespace,&macroName,&result,version);
          this = this + 1;
        } while (EVar4 == Ignore);
        if (EVar4 != Ok) goto LAB_00185e3c;
        macroNamespace._M_string_length = 0;
        EVar4 = Ok;
        *macroNamespace._M_dataplus._M_p = '\0';
        macroName._M_string_length = 0;
        *macroName._M_dataplus._M_p = '\0';
        macroExpanders = local_58;
      }
      else {
        std::__cxx11::string::push_back((char)&macroName);
        EVar4 = Error;
      }
    }
    else if (EVar4 == Ignore) {
      if (cVar1 == '{') {
        local_68 = &macroNamespace;
        __it = (anonymous_namespace)::ValidPrefixes;
        for (lVar6 = 0x20; lVar6 != 0; lVar6 = lVar6 + -0x20) {
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::IsValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<(anonymous_namespace)::IsValidMacroNamespace(std::__cxx11::string_const&)::__0>
                                *)&local_68,(char **)__it);
          if (bVar3) {
            EVar4 = Error;
            if (lVar6 != 0) goto LAB_00185dbf;
            break;
          }
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::IsValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<(anonymous_namespace)::IsValidMacroNamespace(std::__cxx11::string_const&)::__0>
                                *)&local_68,(char **)((long)__it + 8));
          if (((bVar3) ||
              (bVar3 = __gnu_cxx::__ops::
                       _Iter_pred<(anonymous_namespace)::IsValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                       ::operator()((_Iter_pred<(anonymous_namespace)::IsValidMacroNamespace(std::__cxx11::string_const&)::__0>
                                     *)&local_68,(char **)((long)__it + 0x10)), bVar3)) ||
             (bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<(anonymous_namespace)::IsValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                      ::operator()((_Iter_pred<(anonymous_namespace)::IsValidMacroNamespace(std::__cxx11::string_const&)::__0>
                                    *)&local_68,(char **)((long)__it + 0x18)), bVar3)) {
            EVar4 = Error;
            goto LAB_00185dbf;
          }
          __it = (undefined1 *)((long)__it + 0x20);
        }
        std::__cxx11::string::push_back((char)&result);
        std::__cxx11::string::append((string *)&result);
        std::__cxx11::string::push_back((char)&result);
      }
      else {
        std::__cxx11::string::push_back((char)&macroNamespace);
        local_68 = &macroNamespace;
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                ::operator()((_Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::__0>
                              *)&local_68,(char **)(anonymous_namespace)::ValidPrefixes);
        if ((((bVar3) ||
             (bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                      ::operator()((_Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::__0>
                                    *)&local_68,(char **)((anonymous_namespace)::ValidPrefixes + 8))
             , bVar3)) ||
            (bVar3 = __gnu_cxx::__ops::
                     _Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                     ::operator()((_Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::__0>
                                   *)&local_68,
                                  (char **)((anonymous_namespace)::ValidPrefixes + 0x10)), bVar3))
           || (bVar3 = __gnu_cxx::__ops::
                       _Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                       ::operator()((_Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::__0>
                                     *)&local_68,
                                    (char **)((anonymous_namespace)::ValidPrefixes + 0x18)), bVar3))
        {
          EVar4 = Ignore;
          goto LAB_00185dbf;
        }
        std::__cxx11::string::push_back((char)&result);
        std::__cxx11::string::append((string *)&result);
      }
      macroNamespace._M_string_length = 0;
      *macroNamespace._M_dataplus._M_p = '\0';
      EVar4 = Ok;
    }
    else {
      EVar4 = Ignore;
      if (cVar1 != '$') {
        EVar4 = Ok;
        std::__cxx11::string::push_back((char)&result);
      }
    }
LAB_00185dbf:
  }
  if (EVar4 != Error) {
    if (EVar4 == Ignore) {
      std::__cxx11::string::push_back((char)&result);
      std::__cxx11::string::append((string *)&result);
    }
    std::__cxx11::string::operator=((string *)local_60,(string *)&result);
    EVar4 = Ok;
  }
LAB_00185e3c:
  std::__cxx11::string::~string((string *)&macroName);
  std::__cxx11::string::~string((string *)&macroNamespace);
  std::__cxx11::string::~string((string *)&result);
  return EVar4;
}

Assistant:

ExpandMacroResult ExpandMacros(
  std::string& out, const std::vector<MacroExpander>& macroExpanders,
  int version)
{
  std::string result;
  std::string macroNamespace;
  std::string macroName;

  enum class State
  {
    Default,
    MacroNamespace,
    MacroName,
  } state = State::Default;

  for (auto c : out) {
    switch (state) {
      case State::Default:
        if (c == '$') {
          state = State::MacroNamespace;
        } else {
          result += c;
        }
        break;

      case State::MacroNamespace:
        if (c == '{') {
          if (IsValidMacroNamespace(macroNamespace)) {
            state = State::MacroName;
          } else {
            result += '$';
            result += macroNamespace;
            result += '{';
            macroNamespace.clear();
            state = State::Default;
          }
        } else {
          macroNamespace += c;
          if (!PrefixesValidMacroNamespace(macroNamespace)) {
            result += '$';
            result += macroNamespace;
            macroNamespace.clear();
            state = State::Default;
          }
        }
        break;

      case State::MacroName:
        if (c == '}') {
          auto e = ExpandMacro(result, macroNamespace, macroName,
                               macroExpanders, version);
          if (e != ExpandMacroResult::Ok) {
            return e;
          }
          macroNamespace.clear();
          macroName.clear();
          state = State::Default;
        } else {
          macroName += c;
        }
        break;
    }
  }

  switch (state) {
    case State::Default:
      break;
    case State::MacroNamespace:
      result += '$';
      result += macroNamespace;
      break;
    case State::MacroName:
      return ExpandMacroResult::Error;
  }

  out = std::move(result);
  return ExpandMacroResult::Ok;
}